

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__decode_half_float_linear_AR(float *decodep,int width_times_channels,void *inputp)

{
  float *pfVar1;
  bool bVar2;
  float fVar3;
  __m128 of1;
  __m128 of0;
  stbir__FP16 *end_input_m8;
  stbir__FP16 *input;
  float *decode_end;
  float *decode;
  void *inputp_local;
  int width_times_channels_local;
  float *decodep_local;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  pfVar1 = decodep + width_times_channels;
  if (width_times_channels < 8) {
    end_input_m8 = (stbir__FP16 *)inputp;
    for (decode_end = decodep + 4; decode_end <= pfVar1; decode_end = decode_end + 4) {
      fVar3 = stbir__half_to_float(end_input_m8[1]);
      decode_end[-4] = fVar3;
      fVar3 = stbir__half_to_float(*end_input_m8);
      decode_end[-3] = fVar3;
      fVar3 = stbir__half_to_float(end_input_m8[3]);
      decode_end[-2] = fVar3;
      fVar3 = stbir__half_to_float(end_input_m8[2]);
      decode_end[-1] = fVar3;
      end_input_m8 = end_input_m8 + 4;
    }
    for (decode_end = decode_end + -4; decode_end < pfVar1; decode_end = decode_end + 2) {
      fVar3 = stbir__half_to_float(end_input_m8[1]);
      *decode_end = fVar3;
      fVar3 = stbir__half_to_float(*end_input_m8);
      decode_end[1] = fVar3;
      end_input_m8 = end_input_m8 + 2;
    }
  }
  else {
    end_input_m8 = (stbir__FP16 *)inputp;
    decode_end = decodep;
    do {
      do {
        stbir__half_to_float_SIMD(decode_end,end_input_m8);
        local_18 = (undefined4)*(undefined8 *)decode_end;
        uStack_14 = (undefined4)((ulong)*(undefined8 *)decode_end >> 0x20);
        uStack_10 = (undefined4)*(undefined8 *)(decode_end + 2);
        uStack_c = (undefined4)((ulong)*(undefined8 *)(decode_end + 2) >> 0x20);
        local_28 = (undefined4)*(undefined8 *)(decode_end + 4);
        uStack_24 = (undefined4)((ulong)*(undefined8 *)(decode_end + 4) >> 0x20);
        uStack_20 = (undefined4)*(undefined8 *)(decode_end + 6);
        uStack_1c = (undefined4)((ulong)*(undefined8 *)(decode_end + 6) >> 0x20);
        *(ulong *)decode_end = CONCAT44(local_18,uStack_14);
        *(ulong *)(decode_end + 2) = CONCAT44(uStack_10,uStack_c);
        *(ulong *)(decode_end + 4) = CONCAT44(local_28,uStack_24);
        *(ulong *)(decode_end + 6) = CONCAT44(uStack_20,uStack_1c);
        decode_end = decode_end + 8;
        end_input_m8 = end_input_m8 + 8;
      } while (decode_end <= pfVar1 + -8);
      bVar2 = decode_end != pfVar1;
      end_input_m8 = (stbir__FP16 *)((long)inputp + (long)width_times_channels * 2 + -0x10);
      decode_end = pfVar1 + -8;
    } while (bVar2);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME(stbir__decode_half_float_linear)( float * decodep, int width_times_channels, void const * inputp )
{
  float STBIR_STREAMOUT_PTR( * ) decode = decodep;
  float * decode_end = (float*) decode + width_times_channels;
  stbir__FP16 const * input = (stbir__FP16 const *)inputp;

  #ifdef STBIR_SIMD
  if ( width_times_channels >= 8 )
  {
    stbir__FP16 const * end_input_m8 = input + width_times_channels - 8;
    decode_end -= 8;
    STBIR_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      STBIR_NO_UNROLL(decode);

      stbir__half_to_float_SIMD( decode, input );
      #ifdef stbir__decode_swizzle
      #ifdef STBIR_SIMD8
      {
        stbir__simdf8 of;
        stbir__simdf8_load( of, decode );
        stbir__decode_simdf8_flip( of );
        stbir__simdf8_store( decode, of );
      }
      #else
      {
        stbir__simdf of0,of1;
        stbir__simdf_load( of0, decode );
        stbir__simdf_load( of1, decode+4 );
        stbir__decode_simdf4_flip( of0 );
        stbir__decode_simdf4_flip( of1 );
        stbir__simdf_store( decode, of0 );
        stbir__simdf_store( decode+4, of1 );
      }
      #endif
      #endif
      decode += 8;
      input += 8;
      if ( decode <= decode_end )
        continue;
      if ( decode == ( decode_end + 8 ) )
        break;
      decode = decode_end; // backup and do last couple
      input = end_input_m8;
    }
    return;
  }
  #endif

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  decode += 4;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  while( decode <= decode_end )
  {
    STBIR_SIMD_NO_UNROLL(decode);
    decode[0-4] = stbir__half_to_float(input[stbir__decode_order0]);
    decode[1-4] = stbir__half_to_float(input[stbir__decode_order1]);
    decode[2-4] = stbir__half_to_float(input[stbir__decode_order2]);
    decode[3-4] = stbir__half_to_float(input[stbir__decode_order3]);
    decode += 4;
    input += 4;
  }
  decode -= 4;
  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( decode < decode_end )
  {
    STBIR_NO_UNROLL(decode);
    decode[0] = stbir__half_to_float(input[stbir__decode_order0]);
    #if stbir__coder_min_num >= 2
    decode[1] = stbir__half_to_float(input[stbir__decode_order1]);
    #endif
    #if stbir__coder_min_num >= 3
    decode[2] = stbir__half_to_float(input[stbir__decode_order2]);
    #endif
    decode += stbir__coder_min_num;
    input += stbir__coder_min_num;
  }
  #endif
}